

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int *piVar12;
  void *pvVar13;
  size_t sVar14;
  undefined4 *puVar15;
  Layer *pLVar16;
  float *pfVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined4 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  Mat *pMVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  float *pfVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  undefined1 (*pauVar51) [32];
  long lVar52;
  undefined1 (*pauVar53) [16];
  ulong uVar54;
  void *pvVar55;
  int iVar56;
  int iVar57;
  ulong uVar58;
  size_t sVar59;
  int x;
  long lVar60;
  ulong uVar61;
  float fVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [28];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar114 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar164 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [16];
  float fVar196;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  long local_320;
  ulong local_2f8;
  uint local_2d8;
  int local_2c8;
  Mat local_298;
  uint local_248;
  uint local_238;
  undefined1 auStack_234 [12];
  ulong local_228;
  void *local_220;
  long local_218;
  void *local_210;
  undefined1 local_208 [40];
  undefined1 auStack_1e0 [16];
  ulong uStack_1d0;
  size_t local_1c8;
  Mat *local_1c0;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  int local_180;
  size_t local_178;
  ulong local_170;
  ulong local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  void *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  Allocator *local_138;
  int local_130;
  Allocator *local_128;
  undefined1 local_120 [16];
  int local_110;
  ulong local_108;
  void *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  int local_e0;
  Allocator *local_d8;
  undefined1 local_d0 [16];
  int local_c0;
  ulong local_b8;
  undefined1 local_a8 [16];
  long local_90;
  void *local_88;
  void *local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar27;
  undefined3 uVar29;
  undefined2 uVar31;
  undefined1 auVar86 [32];
  undefined1 auVar106 [32];
  undefined1 auVar115 [32];
  
  uVar54 = bottom_blob->elemsize;
  local_228 = (ulong)bottom_blob->elempack;
  uVar34 = 1;
  if (opt->use_packing_layout == true) {
    uVar35 = (this->super_DeconvolutionDepthWise).num_output;
    uVar34 = 8;
    if ((uVar35 & 7) != 0) {
      uVar34 = (uint)((uVar35 & 3) == 0) * 3 + 1;
    }
  }
  local_168._0_4_ = bottom_blob->w;
  local_168._4_4_ = bottom_blob->h;
  uVar2 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar6 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar175._4_4_ = uVar6;
  auVar175._0_4_ = uVar2;
  uVar3 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar7 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar111._4_4_ = uVar7;
  auVar111._0_4_ = uVar3;
  uVar4 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar8 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar148._4_4_ = uVar8;
  auVar148._0_4_ = uVar4;
  uVar35 = bottom_blob->c;
  uVar61 = (ulong)uVar35;
  uVar5 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar9 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar164._4_4_ = uVar9;
  auVar164._0_4_ = uVar5;
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  auVar113._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar113._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar113._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar113._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar167 = vpcmpgtd_avx(auVar113,(undefined1  [16])0x0);
  lVar60 = 0x10;
  if (((((auVar167 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar167 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar167 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar167[0xf])
     && ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
          ((this->super_DeconvolutionDepthWise).output_h < 1)) &&
         (lVar60 = 8, &local_298 != top_blob)))) {
    piVar12 = top_blob->refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    local_298.data = top_blob->data;
    local_298.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_298.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_298.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_298.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_298.elempack = top_blob->elempack;
    local_298.allocator = top_blob->allocator;
    auVar167._0_4_ = top_blob->dims;
    auVar167._4_4_ = top_blob->w;
    uVar10 = top_blob->h;
    uVar11 = top_blob->d;
    auVar167._8_8_ = CONCAT44(uVar11,uVar10);
    local_298.c = top_blob->c;
    local_298.cstep = top_blob->cstep;
    local_298.dims = auVar167._0_4_;
    local_298.w = auVar167._4_4_;
    local_298._48_8_ = auVar167._8_8_;
  }
  auVar175._8_8_ = 0;
  auVar111._8_8_ = 0;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = local_168;
  uStack_160 = 0;
  auVar148._8_8_ = 0;
  auVar164._8_8_ = 0;
  auVar167 = vpcmpeqd_avx(auVar167,auVar167);
  auVar113 = vpaddd_avx(auVar175,auVar167);
  local_a8 = vpmulld_avx(auVar113,auVar111);
  auVar113 = vpaddd_avx(auVar179,auVar167);
  auVar113 = vpmulld_avx(auVar148,auVar113);
  auVar113 = vpaddd_avx(local_a8,auVar113);
  auVar113 = vpaddd_avx(auVar113,auVar164);
  local_158 = vpsubd_avx(auVar113,auVar167);
  sVar59 = (uVar54 / local_228) * (ulong)uVar34;
  iVar41 = local_158._0_4_;
  iVar47 = local_158._4_4_;
  local_1c0 = top_blob;
  Mat::create(&local_298,iVar41,iVar47,(this->super_DeconvolutionDepthWise).num_output / (int)uVar34
              ,sVar59,uVar34,*(Allocator **)(&opt->lightmode + lVar60));
  iVar48 = -100;
  if ((local_298.data == (void *)0x0) || ((long)local_298.c * local_298.cstep == 0))
  goto LAB_0046c4fd;
  iVar48 = (this->super_DeconvolutionDepthWise).num_output;
  iVar57 = (int)local_228;
  iVar56 = (this->super_DeconvolutionDepthWise).group;
  if (iVar56 == iVar48 && uVar35 * iVar57 == iVar56) {
    uVar34 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    local_170 = (ulong)uVar34;
    uVar1 = local_a8._4_4_;
    iVar56 = (int)local_168;
    iVar48 = (int)(local_168 >> 0x20);
    if (iVar57 == 1) {
      if (0 < (int)uVar35) {
        local_218 = local_298.cstep *
                    CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        local_80 = local_298.data;
        local_220 = (this->weight_data_tm).data;
        iVar57 = bottom_blob->w;
        local_88 = bottom_blob->data;
        sVar59 = bottom_blob->elemsize;
        local_90 = bottom_blob->cstep * sVar59;
        auVar113 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
        auVar113 = vpmovsxdq_avx(auVar113);
        uVar44 = vmovmskpd_avx(auVar113);
        uVar54 = 1;
        if (1 < (int)uVar35) {
          uVar54 = uVar61;
        }
        local_158._0_8_ = uVar54;
        local_238 = iVar48;
        local_168 = (long)(int)uVar34 << 2;
        local_228 = CONCAT44(local_228._4_4_,-local_a8._0_4_);
        local_320 = 0;
        do {
          pvVar13 = local_88;
          if ((byte)((byte)uVar44 >> 1) != 0) {
            lVar60 = local_90 * local_320;
            pfVar46 = (float *)(local_218 * local_320 + (long)local_80);
            uVar34 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar48 = (this->super_DeconvolutionDepthWise).bias_term;
            iVar39 = (this->super_DeconvolutionDepthWise).activation_type;
            iVar50 = 0;
            do {
              if ((uVar44 & 1) != 0) {
                local_210 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar36 = (this->super_DeconvolutionDepthWise).dilation_h;
                pfVar17 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar42 = 0;
                local_248 = (uint)local_228;
                do {
                  if (iVar48 == 0) {
                    auVar136 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar136 = ZEXT464(*(uint *)((long)local_210 + local_320 * 4));
                  }
                  auVar113 = auVar136._0_16_;
                  if (0 < (int)uVar34) {
                    iVar37 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar35 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar43 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar54 = 0;
                    pvVar55 = local_220;
                    do {
                      iVar38 = iVar36 * (int)uVar54 + (iVar50 - uVar1);
                      if (-1 < iVar38) {
                        iVar40 = iVar38 / iVar37;
                        if ((iVar40 < (int)local_238 && iVar38 % iVar37 == 0) && (0 < (int)uVar35))
                        {
                          uVar61 = 0;
                          uVar45 = local_248;
                          do {
                            if ((-1 < (int)uVar45) &&
                               (iVar38 = (int)uVar45 / iVar43,
                               iVar38 < iVar56 && (int)uVar45 % iVar43 == 0)) {
                              auVar113 = vfmadd231ss_fma(auVar136._0_16_,
                                                         ZEXT416(*(uint *)((long)pvVar55 +
                                                                          uVar61 * 4)),
                                                         ZEXT416(*(uint *)((long)pvVar13 +
                                                                          (long)iVar38 * 4 +
                                                                          (long)iVar40 *
                                                                          (long)iVar57 * sVar59 +
                                                                          lVar60)));
                              auVar136 = ZEXT1664(auVar113);
                            }
                            uVar61 = uVar61 + 1;
                            uVar45 = uVar45 + (this->super_DeconvolutionDepthWise).dilation_w;
                          } while (uVar35 != uVar61);
                        }
                      }
                      auVar113 = auVar136._0_16_;
                      uVar54 = uVar54 + 1;
                      pvVar55 = (void *)((long)pvVar55 + (ulong)uVar35 * 4);
                    } while (uVar54 != uVar34);
                  }
                  fVar195 = auVar113._0_4_;
                  fVar62 = fVar195;
                  switch(iVar39) {
                  case 1:
                    auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
                    fVar62 = auVar113._0_4_;
                    break;
                  case 2:
                    auVar113 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
                    auVar76._8_4_ = 0x3f800000;
                    auVar76._0_8_ = 0x3f8000003f800000;
                    auVar76._12_4_ = 0x3f800000;
                    auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar17),auVar76,auVar113);
                    fVar62 = auVar113._0_4_ * fVar195;
                    break;
                  case 3:
                    auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar17));
                    fVar62 = auVar113._0_4_;
                    if (pfVar17[1] < auVar113._0_4_) {
                      fVar62 = pfVar17[1];
                    }
                    break;
                  case 4:
                    auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                    auVar83._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                    auVar83._8_4_ = auVar113._8_4_ ^ 0x80000000;
                    auVar83._12_4_ = auVar113._12_4_ ^ 0x80000000;
                    auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
                    auVar100._8_4_ = 0x42b0c0a5;
                    auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar100._12_4_ = 0x42b0c0a5;
                    auVar113 = vblendvps_avx(auVar83,auVar100,auVar113);
                    fVar62 = expf(auVar113._0_4_);
                    fVar62 = 1.0 / (fVar62 + 1.0);
                    break;
                  case 5:
                    fVar62 = expf(fVar195);
                    fVar62 = logf(fVar62 + 1.0);
                    fVar62 = tanhf(fVar62);
                    fVar62 = fVar62 * fVar195;
                    break;
                  case 6:
                    fVar196 = *pfVar17;
                    fVar110 = -pfVar17[1] / fVar196;
                    fVar62 = 0.0;
                    if ((fVar110 <= fVar195) &&
                       (fVar62 = fVar195, fVar195 <= fVar110 + 1.0 / fVar196)) {
                      auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar196),auVar113,
                                                 ZEXT416((uint)pfVar17[1]));
                      fVar62 = auVar113._0_4_ * fVar195;
                    }
                  }
                  *pfVar46 = fVar62;
                  pfVar46 = pfVar46 + 1;
                  iVar42 = iVar42 + 1;
                  local_248 = local_248 + 1;
                } while (iVar42 != iVar41);
              }
              iVar50 = iVar50 + 1;
            } while (iVar50 != iVar47);
          }
          local_320 = local_320 + 1;
          local_220 = (void *)((long)local_220 + local_168);
        } while (local_320 != local_158._0_8_);
      }
    }
    else if (iVar57 == 4) {
      if (0 < (int)uVar35) {
        local_218 = CONCAT44(local_218._4_4_,uVar34 * 4);
        auVar113 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
        auVar113 = vpmovsxdq_avx(auVar113);
        uVar35 = vmovmskpd_avx(auVar113);
        local_220 = (void *)CONCAT44(local_220._4_4_,uVar35);
        local_2f8 = 0;
        auVar166 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar178 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar181 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar135._8_4_ = 0x3f000000;
        auVar135._0_8_ = 0x3f0000003f000000;
        auVar135._12_4_ = 0x3f000000;
        auVar182 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar90 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar183 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar180 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar186 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        auVar136 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
        auVar185 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
        do {
          if ((byte)((byte)uVar35 >> 1) != 0) {
            pvVar13 = (this->weight_data_tm).data;
            sVar59 = bottom_blob->cstep;
            sVar14 = bottom_blob->elemsize;
            pvVar55 = bottom_blob->data;
            iVar57 = bottom_blob->w;
            pauVar53 = (undefined1 (*) [16])
                       (local_298.cstep * local_2f8 *
                        CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize) +
                       (long)local_298.data);
            local_210 = (void *)(local_2f8 * 0x10);
            iVar39 = 0;
            do {
              if ((uVar35 & 1) != 0) {
                local_238 = iVar39 - local_a8._4_4_;
                iVar36 = 0;
                iVar50 = -local_a8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar187 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar187 = *(undefined1 (*) [16])
                                ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                (long)local_210);
                  }
                  auVar194 = ZEXT1664(auVar187);
                  iVar42 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar42) {
                    local_248 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar44 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar37 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar54 = 0;
                    lVar60 = 0;
                    do {
                      iVar43 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar60 +
                               (iVar39 - local_a8._4_4_);
                      if ((((-1 < iVar43) && (iVar43 % (int)local_248 == 0)) &&
                          (iVar43 / (int)local_248 < iVar48)) && (0 < (int)uVar44)) {
                        uVar49 = (ulong)uVar44;
                        uVar58 = uVar54;
                        iVar38 = iVar50;
                        do {
                          if ((-1 < iVar38) &&
                             (iVar40 = iVar38 / iVar37, iVar40 < iVar56 && iVar38 % iVar37 == 0)) {
                            auVar113 = vfmadd231ps_fma(auVar194._0_16_,
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar55 +
                                                        (long)(iVar40 << 2) * 4 +
                                                        (long)(iVar43 / (int)local_248) *
                                                        (long)iVar57 * sVar14 +
                                                        sVar59 * local_2f8 * sVar14),
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar13 +
                                                        (uVar58 & 0xffffffff) * 4 +
                                                        (long)(int)(uVar34 * 4 * (int)local_2f8) * 4
                                                        ));
                            auVar194 = ZEXT1664(auVar113);
                          }
                          iVar38 = iVar38 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar58 = uVar58 + 4;
                          uVar49 = uVar49 - 1;
                        } while (uVar49 != 0);
                      }
                      auVar187 = auVar194._0_16_;
                      lVar60 = lVar60 + 1;
                      uVar54 = uVar54 + (ulong)uVar44 * 4;
                    } while (lVar60 != iVar42);
                  }
                  auVar111 = auVar182._0_16_;
                  auVar113 = auVar136._0_16_;
                  auVar148 = auVar90._0_16_;
                  auVar167 = auVar180._0_16_;
                  auVar100 = auVar186._0_16_;
                  auVar83 = auVar183._0_16_;
                  auVar179 = auVar181._0_16_;
                  auVar175 = auVar178._0_16_;
                  auVar164 = auVar166._0_16_;
                  fVar62 = auVar187._4_4_;
                  fVar195 = auVar187._8_4_;
                  fVar196 = auVar187._12_4_;
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar187 = vmaxps_avx(auVar187,_DAT_005f10a0);
                    break;
                  case 2:
                    auVar113 = vmaxps_avx(auVar187,(undefined1  [16])0x0);
                    auVar167 = vminps_avx(auVar187,(undefined1  [16])0x0);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar190._4_4_ = uVar1;
                    auVar190._0_4_ = uVar1;
                    auVar190._8_4_ = uVar1;
                    auVar190._12_4_ = uVar1;
                    auVar187 = vfmadd213ps_fma(auVar190,auVar167,auVar113);
                    break;
                  case 3:
                    puVar15 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar15;
                    auVar79._4_4_ = uVar1;
                    auVar79._0_4_ = uVar1;
                    auVar79._8_4_ = uVar1;
                    auVar79._12_4_ = uVar1;
                    uVar1 = puVar15[1];
                    auVar152._4_4_ = uVar1;
                    auVar152._0_4_ = uVar1;
                    auVar152._8_4_ = uVar1;
                    auVar152._12_4_ = uVar1;
                    auVar113 = vmaxps_avx(auVar187,auVar79);
                    auVar187 = vminps_avx(auVar152,auVar113);
                    break;
                  case 4:
                    auVar80._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
                    auVar80._8_4_ = -fVar195;
                    auVar80._12_4_ = -fVar196;
                    auVar164 = vminps_avx(auVar164,auVar80);
                    auVar76 = vmaxps_avx(auVar175,auVar164);
                    auVar164 = vfmadd213ps_fma(auVar179,auVar76,auVar135);
                    auVar188._0_4_ = (int)auVar164._0_4_;
                    auVar188._4_4_ = (int)auVar164._4_4_;
                    auVar188._8_4_ = (int)auVar164._8_4_;
                    auVar188._12_4_ = (int)auVar164._12_4_;
                    auVar175 = vcvtdq2ps_avx(auVar188);
                    auVar164 = vcmpps_avx(auVar164,auVar175,1);
                    auVar164 = vandps_avx(auVar164,auVar111);
                    auVar164 = vsubps_avx(auVar175,auVar164);
                    auVar148 = vfmsub231ps_fma(auVar76,auVar164,auVar148);
                    auVar98._8_4_ = 0x395e8083;
                    auVar98._0_8_ = 0x395e8083395e8083;
                    auVar98._12_4_ = 0x395e8083;
                    auVar148 = vfmsub231ps_fma(auVar148,auVar164,auVar98);
                    auVar189._0_4_ = auVar148._0_4_ * auVar148._0_4_;
                    auVar189._4_4_ = auVar148._4_4_ * auVar148._4_4_;
                    auVar189._8_4_ = auVar148._8_4_ * auVar148._8_4_;
                    auVar189._12_4_ = auVar148._12_4_ * auVar148._12_4_;
                    auVar167 = vfmadd213ps_fma(auVar167,auVar148,auVar83);
                    auVar167 = vfmadd213ps_fma(auVar167,auVar148,auVar100);
                    auVar113 = vfmadd213ps_fma(auVar167,auVar148,auVar113);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar148,auVar185._0_16_);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar148,auVar135);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar189,auVar148);
                    auVar81._0_4_ = auVar113._0_4_ + auVar182._0_4_;
                    auVar81._4_4_ = auVar113._4_4_ + auVar182._4_4_;
                    auVar81._8_4_ = auVar113._8_4_ + auVar182._8_4_;
                    auVar81._12_4_ = auVar113._12_4_ + auVar182._12_4_;
                    auVar153._0_4_ = (int)auVar164._0_4_;
                    auVar153._4_4_ = (int)auVar164._4_4_;
                    auVar153._8_4_ = (int)auVar164._8_4_;
                    auVar153._12_4_ = (int)auVar164._12_4_;
                    auVar113 = vpslld_avx(auVar153,0x17);
                    auVar113 = vpaddd_avx(auVar113,auVar111);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar81,auVar111);
                    auVar187 = vdivps_avx(auVar111,auVar113);
                    break;
                  case 5:
                    auVar76 = vminps_avx(auVar187,auVar164);
                    auVar99 = vmaxps_avx(auVar175,auVar76);
                    auVar76 = vfmadd213ps_fma(auVar179,auVar99,auVar135);
                    auVar168._0_4_ = (int)auVar76._0_4_;
                    auVar168._4_4_ = (int)auVar76._4_4_;
                    auVar168._8_4_ = (int)auVar76._8_4_;
                    auVar168._12_4_ = (int)auVar76._12_4_;
                    auVar82 = vcvtdq2ps_avx(auVar168);
                    auVar76 = vcmpps_avx(auVar76,auVar82,1);
                    auVar76 = vandps_avx(auVar76,auVar111);
                    auVar76 = vsubps_avx(auVar82,auVar76);
                    auVar82 = vfmsub231ps_fma(auVar99,auVar76,auVar148);
                    auVar92._8_4_ = 0xb95e8083;
                    auVar92._0_8_ = 0xb95e8083b95e8083;
                    auVar92._12_4_ = 0xb95e8083;
                    auVar99 = vfnmsub231ps_fma(auVar82,auVar76,auVar92);
                    auVar169._0_4_ = auVar99._0_4_ * auVar99._0_4_;
                    auVar169._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                    auVar169._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                    auVar169._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                    auVar82 = vfmadd213ps_fma(auVar167,auVar99,auVar83);
                    auVar82 = vfmadd213ps_fma(auVar82,auVar99,auVar100);
                    auVar82 = vfmadd213ps_fma(auVar82,auVar99,auVar113);
                    auVar82 = vfmadd213ps_fma(auVar82,auVar99,auVar185._0_16_);
                    auVar82 = vfmadd213ps_fma(auVar82,auVar99,auVar135);
                    auVar82 = vfmadd213ps_fma(auVar82,auVar169,auVar99);
                    auVar93._0_4_ = auVar82._0_4_ + auVar182._0_4_;
                    auVar93._4_4_ = auVar82._4_4_ + auVar182._4_4_;
                    auVar93._8_4_ = auVar82._8_4_ + auVar182._8_4_;
                    auVar93._12_4_ = auVar82._12_4_ + auVar182._12_4_;
                    auVar75._0_4_ = (int)auVar76._0_4_;
                    auVar75._4_4_ = (int)auVar76._4_4_;
                    auVar75._8_4_ = (int)auVar76._8_4_;
                    auVar75._12_4_ = (int)auVar76._12_4_;
                    auVar76 = vpslld_avx(auVar75,0x17);
                    auVar76 = vpaddd_avx(auVar76,auVar111);
                    auVar75 = vfmadd213ps_fma(auVar76,auVar93,auVar111);
                    auVar94._8_4_ = 0x800000;
                    auVar94._0_8_ = 0x80000000800000;
                    auVar94._12_4_ = 0x800000;
                    auVar111 = vmaxps_avx(auVar75,auVar94);
                    auVar76 = vpsrld_avx(auVar111,0x17);
                    auVar125._8_4_ = 0xffffff82;
                    auVar125._0_8_ = 0xffffff82ffffff82;
                    auVar125._12_4_ = 0xffffff82;
                    auVar76 = vpaddd_avx(auVar76,auVar125);
                    auVar126._8_4_ = 0x807fffff;
                    auVar126._0_8_ = 0x807fffff807fffff;
                    auVar126._12_4_ = 0x807fffff;
                    auVar111 = vandps_avx(auVar111,auVar126);
                    auVar99 = vorps_avx(auVar111,auVar135);
                    auVar82 = vcvtdq2ps_avx(auVar76);
                    auVar127._8_4_ = 0x3f3504f3;
                    auVar127._0_8_ = 0x3f3504f33f3504f3;
                    auVar127._12_4_ = 0x3f3504f3;
                    auVar76 = vcmpps_avx(auVar99,auVar127,1);
                    auVar111 = vandps_avx(auVar76,auVar99);
                    auVar95._0_4_ = auVar99._0_4_ + -1.0 + auVar111._0_4_;
                    auVar95._4_4_ = auVar99._4_4_ + -1.0 + auVar111._4_4_;
                    auVar95._8_4_ = auVar99._8_4_ + -1.0 + auVar111._8_4_;
                    auVar95._12_4_ = auVar99._12_4_ + -1.0 + auVar111._12_4_;
                    auVar128._8_4_ = 0x3f800000;
                    auVar128._0_8_ = 0x3f8000003f800000;
                    auVar128._12_4_ = 0x3f800000;
                    auVar111 = vandps_avx(auVar76,auVar128);
                    auVar76 = vsubps_avx(auVar82,auVar111);
                    auVar151._0_4_ = auVar95._0_4_ * auVar95._0_4_;
                    auVar151._4_4_ = auVar95._4_4_ * auVar95._4_4_;
                    auVar151._8_4_ = auVar95._8_4_ * auVar95._8_4_;
                    auVar151._12_4_ = auVar95._12_4_ * auVar95._12_4_;
                    auVar170._8_4_ = 0x3d9021bb;
                    auVar170._0_8_ = 0x3d9021bb3d9021bb;
                    auVar170._12_4_ = 0x3d9021bb;
                    auVar137._8_4_ = 0xbdebd1b8;
                    auVar137._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar137._12_4_ = 0xbdebd1b8;
                    auVar111 = vfmadd213ps_fma(auVar170,auVar95,auVar137);
                    auVar138._8_4_ = 0x3def251a;
                    auVar138._0_8_ = 0x3def251a3def251a;
                    auVar138._12_4_ = 0x3def251a;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar138);
                    auVar139._8_4_ = 0xbdfe5d4f;
                    auVar139._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar139._12_4_ = 0xbdfe5d4f;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar139);
                    auVar140._8_4_ = 0x3e11e9bf;
                    auVar140._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar140._12_4_ = 0x3e11e9bf;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar140);
                    auVar141._8_4_ = 0xbe2aae50;
                    auVar141._0_8_ = 0xbe2aae50be2aae50;
                    auVar141._12_4_ = 0xbe2aae50;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar141);
                    auVar142._8_4_ = 0x3e4cceac;
                    auVar142._0_8_ = 0x3e4cceac3e4cceac;
                    auVar142._12_4_ = 0x3e4cceac;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar142);
                    auVar143._8_4_ = 0xbe7ffffc;
                    auVar143._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar143._12_4_ = 0xbe7ffffc;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar143);
                    auVar144._8_4_ = 0x3eaaaaaa;
                    auVar144._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar144._12_4_ = 0x3eaaaaaa;
                    auVar111 = vfmadd213ps_fma(auVar111,auVar95,auVar144);
                    auVar165._0_4_ = auVar151._0_4_ * auVar95._0_4_ * auVar111._0_4_;
                    auVar165._4_4_ = auVar151._4_4_ * auVar95._4_4_ * auVar111._4_4_;
                    auVar165._8_4_ = auVar151._8_4_ * auVar95._8_4_ * auVar111._8_4_;
                    auVar165._12_4_ = auVar151._12_4_ * auVar95._12_4_ * auVar111._12_4_;
                    auVar171._8_4_ = 0xb95e8083;
                    auVar171._0_8_ = 0xb95e8083b95e8083;
                    auVar171._12_4_ = 0xb95e8083;
                    auVar111 = vfmadd231ps_fma(auVar165,auVar76,auVar171);
                    auVar82 = vfmsub231ps_fma(auVar111,auVar135,auVar151);
                    auVar111 = vcmpps_avx(auVar75,_DAT_005f10a0,2);
                    auVar82 = vsubps_avx(auVar82,auVar95);
                    auVar166 = ZEXT1664(auVar164);
                    auVar178 = ZEXT1664(auVar175);
                    auVar181 = ZEXT1664(auVar179);
                    auVar183 = ZEXT1664(auVar83);
                    auVar186 = ZEXT1664(auVar100);
                    auVar180 = ZEXT1664(auVar167);
                    auVar90 = ZEXT1664(auVar148);
                    auVar136 = ZEXT1664(auVar113);
                    auVar76 = vfnmadd231ps_fma(auVar82,auVar148,auVar76);
                    auVar96._0_4_ = auVar76._0_4_ + auVar76._0_4_;
                    auVar96._4_4_ = auVar76._4_4_ + auVar76._4_4_;
                    auVar96._8_4_ = auVar76._8_4_ + auVar76._8_4_;
                    auVar96._12_4_ = auVar76._12_4_ + auVar76._12_4_;
                    auVar129._8_4_ = 0x7fffffff;
                    auVar129._0_8_ = 0x7fffffff7fffffff;
                    auVar129._12_4_ = 0x7fffffff;
                    auVar111 = vblendvps_avx(auVar96,auVar129,auVar111);
                    auVar111 = vminps_avx(auVar164,auVar111);
                    auVar175 = vmaxps_avx(auVar175,auVar111);
                    auVar111 = vfmadd213ps_fma(auVar179,auVar175,auVar135);
                    auVar130._0_4_ = (int)auVar111._0_4_;
                    auVar130._4_4_ = (int)auVar111._4_4_;
                    auVar130._8_4_ = (int)auVar111._8_4_;
                    auVar130._12_4_ = (int)auVar111._12_4_;
                    auVar164 = vcvtdq2ps_avx(auVar130);
                    auVar111 = vcmpps_avx(auVar111,auVar164,1);
                    auVar145._8_4_ = 0x3f800000;
                    auVar145._0_8_ = 0x3f8000003f800000;
                    auVar145._12_4_ = 0x3f800000;
                    auVar111 = vandps_avx(auVar111,auVar145);
                    auVar146._8_4_ = 0x3e2aaaaa;
                    auVar146._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar146._12_4_ = 0x3e2aaaaa;
                    auVar185 = ZEXT1664(auVar146);
                    auVar111 = vsubps_avx(auVar164,auVar111);
                    auVar148 = vfmsub231ps_fma(auVar175,auVar111,auVar148);
                    auVar131._8_4_ = 0xb95e8083;
                    auVar131._0_8_ = 0xb95e8083b95e8083;
                    auVar131._12_4_ = 0xb95e8083;
                    auVar148 = vfnmsub231ps_fma(auVar148,auVar111,auVar131);
                    auVar132._0_4_ = auVar148._0_4_ * auVar148._0_4_;
                    auVar132._4_4_ = auVar148._4_4_ * auVar148._4_4_;
                    auVar132._8_4_ = auVar148._8_4_ * auVar148._8_4_;
                    auVar132._12_4_ = auVar148._12_4_ * auVar148._12_4_;
                    auVar167 = vfmadd213ps_fma(auVar167,auVar148,auVar83);
                    auVar167 = vfmadd213ps_fma(auVar167,auVar148,auVar100);
                    auVar113 = vfmadd213ps_fma(auVar167,auVar148,auVar113);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar148,auVar146);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar148,auVar135);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar132,auVar148);
                    auVar133._8_4_ = 0x3f800000;
                    auVar133._0_8_ = 0x3f8000003f800000;
                    auVar133._12_4_ = 0x3f800000;
                    auVar182 = ZEXT1664(auVar133);
                    auVar77._0_4_ = auVar113._0_4_ + 1.0;
                    auVar77._4_4_ = auVar113._4_4_ + 1.0;
                    auVar77._8_4_ = auVar113._8_4_ + 1.0;
                    auVar77._12_4_ = auVar113._12_4_ + 1.0;
                    auVar97._0_4_ = (int)auVar111._0_4_;
                    auVar97._4_4_ = (int)auVar111._4_4_;
                    auVar97._8_4_ = (int)auVar111._8_4_;
                    auVar97._12_4_ = (int)auVar111._12_4_;
                    auVar113 = vpslld_avx(auVar97,0x17);
                    auVar113 = vpaddd_avx(auVar113,auVar133);
                    auVar113 = vfmadd213ps_fma(auVar113,auVar77,auVar133);
                    auVar78._8_4_ = 0x40000000;
                    auVar78._0_8_ = 0x4000000040000000;
                    auVar78._12_4_ = 0x40000000;
                    auVar113 = vdivps_avx(auVar78,auVar113);
                    auVar187 = vfmsub231ps_fma(auVar187,auVar187,auVar113);
                    break;
                  case 6:
                    puVar15 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar15;
                    auVar82._4_4_ = uVar1;
                    auVar82._0_4_ = uVar1;
                    auVar82._8_4_ = uVar1;
                    auVar82._12_4_ = uVar1;
                    uVar1 = puVar15[1];
                    auVar99._4_4_ = uVar1;
                    auVar99._0_4_ = uVar1;
                    auVar99._8_4_ = uVar1;
                    auVar99._12_4_ = uVar1;
                    auVar113 = vfmadd231ps_fma(auVar99,auVar187,auVar82);
                    auVar113 = vmaxps_avx(auVar113,_DAT_005f10a0);
                    auVar113 = vminps_avx(auVar113,auVar111);
                    auVar187._0_4_ = auVar187._0_4_ * auVar113._0_4_;
                    auVar187._4_4_ = fVar62 * auVar113._4_4_;
                    auVar187._8_4_ = fVar195 * auVar113._8_4_;
                    auVar187._12_4_ = fVar196 * auVar113._12_4_;
                  }
                  *pauVar53 = auVar187;
                  pauVar53 = pauVar53 + 1;
                  iVar36 = iVar36 + 1;
                  iVar50 = iVar50 + 1;
                } while (iVar36 != iVar41);
              }
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar47);
          }
          local_2f8 = local_2f8 + 1;
        } while (local_2f8 != uVar61);
      }
    }
    else if ((iVar57 == 8) && (0 < (int)uVar35)) {
      local_218 = CONCAT44(local_218._4_4_,uVar34 * 8);
      auVar113 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
      auVar113 = vpmovsxdq_avx(auVar113);
      uVar35 = vmovmskpd_avx(auVar113);
      local_220 = (void *)CONCAT44(local_220._4_4_,uVar35);
      local_2f8 = 0;
      auVar180 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar147._8_4_ = 0x3f000000;
      auVar147._0_8_ = 0x3f0000003f000000;
      auVar147._12_4_ = 0x3f000000;
      auVar147._16_4_ = 0x3f000000;
      auVar147._20_4_ = 0x3f000000;
      auVar147._24_4_ = 0x3f000000;
      auVar147._28_4_ = 0x3f000000;
      auVar182 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar136 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar185 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if ((byte)((byte)uVar35 >> 1) != 0) {
          pvVar13 = (this->weight_data_tm).data;
          sVar59 = bottom_blob->cstep;
          sVar14 = bottom_blob->elemsize;
          pvVar55 = bottom_blob->data;
          iVar57 = bottom_blob->w;
          pauVar51 = (undefined1 (*) [32])
                     (local_298.cstep * local_2f8 *
                      CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize) +
                     (long)local_298.data);
          local_210 = (void *)(local_2f8 * 0x20);
          iVar39 = 0;
          do {
            if ((uVar35 & 1) != 0) {
              local_238 = iVar39 - local_a8._4_4_;
              iVar36 = 0;
              iVar50 = -local_a8._0_4_;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar90 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar90 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                      (long)local_210));
                }
                lVar60 = (long)(this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < lVar60) {
                  local_248 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar44 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar42 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar54 = 0;
                  lVar52 = 0;
                  do {
                    iVar37 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar52 +
                             (iVar39 - local_a8._4_4_);
                    if ((((-1 < iVar37) && (iVar37 % (int)local_248 == 0)) &&
                        (iVar37 / (int)local_248 < iVar48)) && (0 < (int)uVar44)) {
                      uVar49 = uVar54;
                      uVar58 = (ulong)uVar44;
                      iVar43 = iVar50;
                      do {
                        if ((-1 < iVar43) &&
                           (iVar38 = iVar43 / iVar42, iVar38 < iVar56 && iVar43 % iVar42 == 0)) {
                          auVar113 = vfmadd231ps_fma(auVar90._0_32_,
                                                     *(undefined1 (*) [32])
                                                      ((long)pvVar55 +
                                                      (long)(iVar38 << 3) * 4 +
                                                      (long)(iVar37 / (int)local_248) *
                                                      (long)iVar57 * sVar14 +
                                                      sVar59 * local_2f8 * sVar14),
                                                     *(undefined1 (*) [32])
                                                      ((long)pvVar13 +
                                                      (uVar49 & 0xffffffff) * 4 +
                                                      (long)(int)(uVar34 * 8 * (int)local_2f8) * 4))
                          ;
                          auVar90 = ZEXT1664(auVar113);
                        }
                        iVar43 = iVar43 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar49 = uVar49 + 8;
                        uVar58 = uVar58 - 1;
                      } while (uVar58 != 0);
                    }
                    lVar52 = lVar52 + 1;
                    uVar54 = uVar54 + (ulong)uVar44 * 8;
                  } while (lVar52 != lVar60);
                }
                auVar89 = auVar90._0_32_;
                auVar70 = auVar136._0_32_;
                auVar68 = auVar185._0_32_;
                auVar85 = auVar180._0_32_;
                auVar123 = auVar182._0_32_;
                fVar62 = auVar136._0_4_;
                fVar195 = auVar136._4_4_;
                fVar196 = auVar136._8_4_;
                fVar110 = auVar136._12_4_;
                fVar19 = auVar136._16_4_;
                fVar20 = auVar136._20_4_;
                fVar21 = auVar136._24_4_;
                fVar22 = auVar136._28_4_;
                auVar166._28_36_ = auVar90._28_36_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar89 = vmaxps_avx(auVar89,_DAT_005f4f20);
                  break;
                case 2:
                  auVar70 = vmaxps_avx(auVar89,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar89 = vminps_avx(auVar89,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar88._4_4_ = uVar1;
                  auVar88._0_4_ = uVar1;
                  auVar88._8_4_ = uVar1;
                  auVar88._12_4_ = uVar1;
                  auVar88._16_4_ = uVar1;
                  auVar88._20_4_ = uVar1;
                  auVar88._24_4_ = uVar1;
                  auVar88._28_4_ = uVar1;
                  auVar113 = vfmadd213ps_fma(auVar88,auVar89,auVar70);
                  auVar89 = ZEXT1632(auVar113);
                  break;
                case 3:
                  puVar15 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar15;
                  auVar108._4_4_ = uVar1;
                  auVar108._0_4_ = uVar1;
                  auVar108._8_4_ = uVar1;
                  auVar108._12_4_ = uVar1;
                  auVar108._16_4_ = uVar1;
                  auVar108._20_4_ = uVar1;
                  auVar108._24_4_ = uVar1;
                  auVar108._28_4_ = uVar1;
                  uVar1 = puVar15[1];
                  auVar193._4_4_ = uVar1;
                  auVar193._0_4_ = uVar1;
                  auVar193._8_4_ = uVar1;
                  auVar193._12_4_ = uVar1;
                  auVar193._16_4_ = uVar1;
                  auVar193._20_4_ = uVar1;
                  auVar193._24_4_ = uVar1;
                  auVar193._28_4_ = uVar1;
                  auVar89 = vmaxps_avx(auVar89,auVar108);
                  auVar89 = vminps_avx(auVar193,auVar89);
                  break;
                case 4:
                  auVar84._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
                  auVar84._8_4_ = -auVar90._8_4_;
                  auVar84._12_4_ = -auVar90._12_4_;
                  auVar84._16_4_ = -auVar90._16_4_;
                  auVar84._20_4_ = -auVar90._20_4_;
                  auVar84._24_4_ = -auVar90._24_4_;
                  auVar84._28_4_ = auVar90._28_4_ ^ 0x80000000;
                  auVar71._8_4_ = 0x42b0c0a5;
                  auVar71._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar71._12_4_ = 0x42b0c0a5;
                  auVar71._16_4_ = 0x42b0c0a5;
                  auVar71._20_4_ = 0x42b0c0a5;
                  auVar71._24_4_ = 0x42b0c0a5;
                  auVar71._28_4_ = 0x42b0c0a5;
                  auVar89 = vminps_avx(auVar84,auVar71);
                  auVar85 = vmaxps_avx(auVar85,auVar89);
                  auVar113 = vfmadd213ps_fma(auVar123,auVar85,auVar147);
                  auVar123 = vroundps_avx(ZEXT1632(auVar113),1);
                  auVar89 = vcmpps_avx(ZEXT1632(auVar113),auVar123,1);
                  auVar89 = vandps_avx(auVar89,auVar70);
                  auVar89 = vsubps_avx(auVar123,auVar89);
                  auVar72._8_4_ = 0x3f318000;
                  auVar72._0_8_ = 0x3f3180003f318000;
                  auVar72._12_4_ = 0x3f318000;
                  auVar72._16_4_ = 0x3f318000;
                  auVar72._20_4_ = 0x3f318000;
                  auVar72._24_4_ = 0x3f318000;
                  auVar72._28_4_ = 0x3f318000;
                  auVar113 = vfmsub231ps_fma(auVar85,auVar89,auVar72);
                  auVar119._8_4_ = 0x395e8083;
                  auVar119._0_8_ = 0x395e8083395e8083;
                  auVar119._12_4_ = 0x395e8083;
                  auVar119._16_4_ = 0x395e8083;
                  auVar119._20_4_ = 0x395e8083;
                  auVar119._24_4_ = 0x395e8083;
                  auVar119._28_4_ = 0x395e8083;
                  auVar167 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar89,auVar119);
                  auVar85 = ZEXT1632(auVar167);
                  auVar24._28_4_ = auVar123._28_4_;
                  auVar24._0_28_ =
                       ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                          CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                                   CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                            auVar167._0_4_ * auVar167._0_4_))));
                  auVar73._8_4_ = 0x3ab743ce;
                  auVar73._0_8_ = 0x3ab743ce3ab743ce;
                  auVar73._12_4_ = 0x3ab743ce;
                  auVar73._16_4_ = 0x3ab743ce;
                  auVar73._20_4_ = 0x3ab743ce;
                  auVar73._24_4_ = 0x3ab743ce;
                  auVar73._28_4_ = 0x3ab743ce;
                  auVar113 = vfmadd213ps_fma(auVar68,auVar85,auVar73);
                  auVar120._8_4_ = 0x3c088908;
                  auVar120._0_8_ = 0x3c0889083c088908;
                  auVar120._12_4_ = 0x3c088908;
                  auVar120._16_4_ = 0x3c088908;
                  auVar120._20_4_ = 0x3c088908;
                  auVar120._24_4_ = 0x3c088908;
                  auVar120._28_4_ = 0x3c088908;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar120);
                  auVar121._8_4_ = 0x3d2aa9c1;
                  auVar121._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar121._12_4_ = 0x3d2aa9c1;
                  auVar121._16_4_ = 0x3d2aa9c1;
                  auVar121._20_4_ = 0x3d2aa9c1;
                  auVar121._24_4_ = 0x3d2aa9c1;
                  auVar121._28_4_ = 0x3d2aa9c1;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar121);
                  auVar122._8_4_ = 0x3e2aaaaa;
                  auVar122._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar122._12_4_ = 0x3e2aaaaa;
                  auVar122._16_4_ = 0x3e2aaaaa;
                  auVar122._20_4_ = 0x3e2aaaaa;
                  auVar122._24_4_ = 0x3e2aaaaa;
                  auVar122._28_4_ = 0x3e2aaaaa;
                  auVar85 = ZEXT1632(auVar167);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar122);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar147);
                  auVar111 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar24,auVar85);
                  auVar74._0_4_ = (int)auVar89._0_4_;
                  auVar74._4_4_ = (int)auVar89._4_4_;
                  auVar74._8_4_ = (int)auVar89._8_4_;
                  auVar74._12_4_ = (int)auVar89._12_4_;
                  auVar86._16_4_ = (int)auVar89._16_4_;
                  auVar86._0_16_ = auVar74;
                  auVar86._20_4_ = (int)auVar89._20_4_;
                  auVar86._24_4_ = (int)auVar89._24_4_;
                  auVar86._28_4_ = (int)auVar89._28_4_;
                  auVar167 = vpslld_avx(auVar74,0x17);
                  auVar113 = vpslld_avx(auVar86._16_16_,0x17);
                  auVar114._8_4_ = 0x3f800000;
                  auVar114._0_8_ = 0x3f8000003f800000;
                  auVar114._12_4_ = 0x3f800000;
                  auVar113 = vpaddd_avx(auVar113,auVar114);
                  auVar167 = vpaddd_avx(auVar167,auVar114);
                  auVar87._16_16_ = auVar113;
                  auVar87._0_16_ = auVar167;
                  auVar109._0_4_ = auVar111._0_4_ + fVar62;
                  auVar109._4_4_ = auVar111._4_4_ + fVar195;
                  auVar109._8_4_ = auVar111._8_4_ + fVar196;
                  auVar109._12_4_ = auVar111._12_4_ + fVar110;
                  auVar109._16_4_ = fVar19 + 0.0;
                  auVar109._20_4_ = fVar20 + 0.0;
                  auVar109._24_4_ = fVar21 + 0.0;
                  auVar109._28_4_ = fVar22 + 0.0;
                  auVar113 = vfmadd213ps_fma(auVar87,auVar109,auVar70);
                  auVar89 = vdivps_avx(auVar70,ZEXT1632(auVar113));
                  break;
                case 5:
                  auVar176._8_4_ = 0x42b0c0a5;
                  auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar176._12_4_ = 0x42b0c0a5;
                  auVar176._16_4_ = 0x42b0c0a5;
                  auVar176._20_4_ = 0x42b0c0a5;
                  auVar176._24_4_ = 0x42b0c0a5;
                  auVar176._28_4_ = 0x42b0c0a5;
                  auVar89 = vminps_avx(auVar176,auVar89);
                  auVar23 = vmaxps_avx(auVar85,auVar89);
                  auVar113 = vfmadd213ps_fma(auVar123,auVar23,auVar147);
                  auVar102 = vroundps_avx(ZEXT1632(auVar113),1);
                  auVar89 = vcmpps_avx(ZEXT1632(auVar113),auVar102,1);
                  auVar89 = vandps_avx(auVar89,auVar70);
                  auVar89 = vsubps_avx(auVar102,auVar89);
                  auVar149._8_4_ = 0x3f318000;
                  auVar149._0_8_ = 0x3f3180003f318000;
                  auVar149._12_4_ = 0x3f318000;
                  auVar149._16_4_ = 0x3f318000;
                  auVar149._20_4_ = 0x3f318000;
                  auVar149._24_4_ = 0x3f318000;
                  auVar149._28_4_ = 0x3f318000;
                  auVar113 = vfmsub231ps_fma(auVar23,auVar89,auVar149);
                  auVar63._8_4_ = 0xb95e8083;
                  auVar63._0_8_ = 0xb95e8083b95e8083;
                  auVar63._12_4_ = 0xb95e8083;
                  auVar63._16_4_ = 0xb95e8083;
                  auVar63._20_4_ = 0xb95e8083;
                  auVar63._24_4_ = 0xb95e8083;
                  auVar63._28_4_ = 0xb95e8083;
                  auVar167 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar89,auVar63);
                  auVar63 = ZEXT1632(auVar167);
                  auVar23._28_4_ = auVar102._28_4_;
                  auVar23._0_28_ =
                       ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                          CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                                   CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                            auVar167._0_4_ * auVar167._0_4_))));
                  auVar184._8_4_ = 0x3ab743ce;
                  auVar184._0_8_ = 0x3ab743ce3ab743ce;
                  auVar184._12_4_ = 0x3ab743ce;
                  auVar184._16_4_ = 0x3ab743ce;
                  auVar184._20_4_ = 0x3ab743ce;
                  auVar184._24_4_ = 0x3ab743ce;
                  auVar184._28_4_ = 0x3ab743ce;
                  auVar113 = vfmadd213ps_fma(auVar68,auVar63,auVar184);
                  auVar154._8_4_ = 0x3c088908;
                  auVar154._0_8_ = 0x3c0889083c088908;
                  auVar154._12_4_ = 0x3c088908;
                  auVar154._16_4_ = 0x3c088908;
                  auVar154._20_4_ = 0x3c088908;
                  auVar154._24_4_ = 0x3c088908;
                  auVar154._28_4_ = 0x3c088908;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar63,auVar154);
                  auVar134._8_4_ = 0x3d2aa9c1;
                  auVar134._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar134._12_4_ = 0x3d2aa9c1;
                  auVar134._16_4_ = 0x3d2aa9c1;
                  auVar134._20_4_ = 0x3d2aa9c1;
                  auVar134._24_4_ = 0x3d2aa9c1;
                  auVar134._28_4_ = 0x3d2aa9c1;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar63,auVar134);
                  auVar64._8_4_ = 0x3e2aaaaa;
                  auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar64._12_4_ = 0x3e2aaaaa;
                  auVar64._16_4_ = 0x3e2aaaaa;
                  auVar64._20_4_ = 0x3e2aaaaa;
                  auVar64._24_4_ = 0x3e2aaaaa;
                  auVar64._28_4_ = 0x3e2aaaaa;
                  auVar102 = ZEXT1632(auVar167);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar102,auVar64);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar102,auVar147);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar23,auVar102);
                  auVar103._0_4_ = auVar113._0_4_ + fVar62;
                  auVar103._4_4_ = auVar113._4_4_ + fVar195;
                  auVar103._8_4_ = auVar113._8_4_ + fVar196;
                  auVar103._12_4_ = auVar113._12_4_ + fVar110;
                  auVar103._16_4_ = fVar19 + 0.0;
                  auVar103._20_4_ = fVar20 + 0.0;
                  auVar103._24_4_ = fVar21 + 0.0;
                  auVar103._28_4_ = fVar22 + 0.0;
                  auVar112._0_4_ = (int)auVar89._0_4_;
                  auVar112._4_4_ = (int)auVar89._4_4_;
                  auVar112._8_4_ = (int)auVar89._8_4_;
                  auVar112._12_4_ = (int)auVar89._12_4_;
                  auVar115._16_4_ = (int)auVar89._16_4_;
                  auVar115._0_16_ = auVar112;
                  auVar115._20_4_ = (int)auVar89._20_4_;
                  auVar115._24_4_ = (int)auVar89._24_4_;
                  auVar115._28_4_ = (int)auVar89._28_4_;
                  auVar167 = vpslld_avx(auVar112,0x17);
                  auVar113 = vpslld_avx(auVar115._16_16_,0x17);
                  auVar150._8_4_ = 0x3f800000;
                  auVar150._0_8_ = 0x3f8000003f800000;
                  auVar150._12_4_ = 0x3f800000;
                  auVar113 = vpaddd_avx(auVar150,auVar113);
                  auVar167 = vpaddd_avx(auVar167,auVar150);
                  auVar191._16_16_ = auVar113;
                  auVar191._0_16_ = auVar167;
                  auVar111 = vfmadd213ps_fma(auVar191,auVar103,auVar70);
                  auVar65._8_4_ = 0x800000;
                  auVar65._0_8_ = 0x80000000800000;
                  auVar65._12_4_ = 0x800000;
                  auVar65._16_4_ = 0x800000;
                  auVar65._20_4_ = 0x800000;
                  auVar65._24_4_ = 0x800000;
                  auVar65._28_4_ = 0x800000;
                  auVar89 = vmaxps_avx(ZEXT1632(auVar111),auVar65);
                  auVar167 = vpsrld_avx(auVar89._0_16_,0x17);
                  auVar113 = vpsrld_avx(auVar89._16_16_,0x17);
                  auVar66._8_4_ = 0x807fffff;
                  auVar66._0_8_ = 0x807fffff807fffff;
                  auVar66._12_4_ = 0x807fffff;
                  auVar66._16_4_ = 0x807fffff;
                  auVar66._20_4_ = 0x807fffff;
                  auVar66._24_4_ = 0x807fffff;
                  auVar66._28_4_ = 0x807fffff;
                  auVar89 = vandps_avx(auVar89,auVar66);
                  auVar102 = vorps_avx(auVar89,auVar147);
                  auVar67._8_4_ = 0x3f3504f3;
                  auVar67._0_8_ = 0x3f3504f33f3504f3;
                  auVar67._12_4_ = 0x3f3504f3;
                  auVar67._16_4_ = 0x3f3504f3;
                  auVar67._20_4_ = 0x3f3504f3;
                  auVar67._24_4_ = 0x3f3504f3;
                  auVar67._28_4_ = 0x3f3504f3;
                  auVar23 = vcmpps_avx(auVar67,auVar102,2);
                  auVar89 = vandnps_avx(auVar23,auVar102);
                  auVar104._0_4_ = auVar89._0_4_ + auVar102._0_4_ + -1.0;
                  auVar104._4_4_ = auVar89._4_4_ + auVar102._4_4_ + -1.0;
                  auVar104._8_4_ = auVar89._8_4_ + auVar102._8_4_ + -1.0;
                  auVar104._12_4_ = auVar89._12_4_ + auVar102._12_4_ + -1.0;
                  auVar104._16_4_ = auVar89._16_4_ + auVar102._16_4_ + -1.0;
                  auVar104._20_4_ = auVar89._20_4_ + auVar102._20_4_ + -1.0;
                  auVar104._24_4_ = auVar89._24_4_ + auVar102._24_4_ + -1.0;
                  auVar104._28_4_ = auVar89._28_4_ + auVar102._28_4_ + -1.0;
                  auVar113 = vpsubd_avx(auVar113,auVar23._16_16_);
                  auVar174._8_4_ = 0xffffff81;
                  auVar174._0_8_ = 0xffffff81ffffff81;
                  auVar174._12_4_ = 0xffffff81;
                  auVar113 = vpaddd_avx(auVar113,auVar174);
                  auVar167 = vpsubd_avx(auVar167,auVar23._0_16_);
                  auVar167 = vpaddd_avx(auVar174,auVar167);
                  auVar116._16_16_ = auVar113;
                  auVar116._0_16_ = auVar167;
                  auVar89._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                  auVar89._0_4_ = auVar104._0_4_ * auVar104._0_4_;
                  auVar89._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                  auVar89._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                  auVar89._16_4_ = auVar104._16_4_ * auVar104._16_4_;
                  auVar89._20_4_ = auVar104._20_4_ * auVar104._20_4_;
                  auVar89._24_4_ = auVar104._24_4_ * auVar104._24_4_;
                  auVar89._28_4_ = auVar23._28_4_;
                  auVar172._8_4_ = 0x3d9021bb;
                  auVar172._0_8_ = 0x3d9021bb3d9021bb;
                  auVar172._12_4_ = 0x3d9021bb;
                  auVar172._16_4_ = 0x3d9021bb;
                  auVar172._20_4_ = 0x3d9021bb;
                  auVar172._24_4_ = 0x3d9021bb;
                  auVar172._28_4_ = 0x3d9021bb;
                  auVar155._8_4_ = 0xbdebd1b8;
                  auVar155._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar155._12_4_ = 0xbdebd1b8;
                  auVar155._16_4_ = 0xbdebd1b8;
                  auVar155._20_4_ = 0xbdebd1b8;
                  auVar155._24_4_ = 0xbdebd1b8;
                  auVar155._28_4_ = 0xbdebd1b8;
                  auVar113 = vfmadd213ps_fma(auVar172,auVar104,auVar155);
                  auVar156._8_4_ = 0x3def251a;
                  auVar156._0_8_ = 0x3def251a3def251a;
                  auVar156._12_4_ = 0x3def251a;
                  auVar156._16_4_ = 0x3def251a;
                  auVar156._20_4_ = 0x3def251a;
                  auVar156._24_4_ = 0x3def251a;
                  auVar156._28_4_ = 0x3def251a;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar156);
                  auVar157._8_4_ = 0xbdfe5d4f;
                  auVar157._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar157._12_4_ = 0xbdfe5d4f;
                  auVar157._16_4_ = 0xbdfe5d4f;
                  auVar157._20_4_ = 0xbdfe5d4f;
                  auVar157._24_4_ = 0xbdfe5d4f;
                  auVar157._28_4_ = 0xbdfe5d4f;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar157);
                  auVar158._8_4_ = 0x3e11e9bf;
                  auVar158._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar158._12_4_ = 0x3e11e9bf;
                  auVar158._16_4_ = 0x3e11e9bf;
                  auVar158._20_4_ = 0x3e11e9bf;
                  auVar158._24_4_ = 0x3e11e9bf;
                  auVar158._28_4_ = 0x3e11e9bf;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar158);
                  auVar159._8_4_ = 0xbe2aae50;
                  auVar159._0_8_ = 0xbe2aae50be2aae50;
                  auVar159._12_4_ = 0xbe2aae50;
                  auVar159._16_4_ = 0xbe2aae50;
                  auVar159._20_4_ = 0xbe2aae50;
                  auVar159._24_4_ = 0xbe2aae50;
                  auVar159._28_4_ = 0xbe2aae50;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar159);
                  auVar160._8_4_ = 0x3e4cceac;
                  auVar160._0_8_ = 0x3e4cceac3e4cceac;
                  auVar160._12_4_ = 0x3e4cceac;
                  auVar160._16_4_ = 0x3e4cceac;
                  auVar160._20_4_ = 0x3e4cceac;
                  auVar160._24_4_ = 0x3e4cceac;
                  auVar160._28_4_ = 0x3e4cceac;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar160);
                  auVar161._8_4_ = 0xbe7ffffc;
                  auVar161._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar161._12_4_ = 0xbe7ffffc;
                  auVar161._16_4_ = 0xbe7ffffc;
                  auVar161._20_4_ = 0xbe7ffffc;
                  auVar161._24_4_ = 0xbe7ffffc;
                  auVar161._28_4_ = 0xbe7ffffc;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar161);
                  auVar162._8_4_ = 0x3eaaaaaa;
                  auVar162._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar162._12_4_ = 0x3eaaaaaa;
                  auVar162._16_4_ = 0x3eaaaaaa;
                  auVar162._20_4_ = 0x3eaaaaaa;
                  auVar162._24_4_ = 0x3eaaaaaa;
                  auVar162._28_4_ = 0x3eaaaaaa;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar104,auVar162);
                  auVar173._0_4_ = auVar104._0_4_ * auVar104._0_4_ * auVar104._0_4_ * auVar113._0_4_
                  ;
                  auVar173._4_4_ = auVar104._4_4_ * auVar104._4_4_ * auVar104._4_4_ * auVar113._4_4_
                  ;
                  auVar173._8_4_ = auVar104._8_4_ * auVar104._8_4_ * auVar104._8_4_ * auVar113._8_4_
                  ;
                  auVar173._12_4_ =
                       auVar104._12_4_ * auVar104._12_4_ * auVar104._12_4_ * auVar113._12_4_;
                  auVar173._16_4_ = auVar104._16_4_ * auVar104._16_4_ * auVar104._16_4_ * 0.0;
                  auVar173._20_4_ = auVar104._20_4_ * auVar104._20_4_ * auVar104._20_4_ * 0.0;
                  auVar173._24_4_ = auVar104._24_4_ * auVar104._24_4_ * auVar104._24_4_ * 0.0;
                  auVar173._28_4_ = 0;
                  auVar23 = vcvtdq2ps_avx(auVar116);
                  auVar177._8_4_ = 0xb95e8083;
                  auVar177._0_8_ = 0xb95e8083b95e8083;
                  auVar177._12_4_ = 0xb95e8083;
                  auVar177._16_4_ = 0xb95e8083;
                  auVar177._20_4_ = 0xb95e8083;
                  auVar177._24_4_ = 0xb95e8083;
                  auVar177._28_4_ = 0xb95e8083;
                  auVar113 = vfmadd231ps_fma(auVar173,auVar23,auVar177);
                  auVar113 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar147,auVar89);
                  auVar89 = vcmpps_avx(ZEXT1632(auVar111),ZEXT832(0) << 0x20,2);
                  auVar102 = vsubps_avx(ZEXT1632(auVar113),auVar104);
                  auVar113 = vfmsub231ps_fma(auVar102,auVar149,auVar23);
                  auVar163._8_4_ = 0xc0000000;
                  auVar163._0_8_ = 0xc0000000c0000000;
                  auVar163._12_4_ = 0xc0000000;
                  auVar163._16_4_ = 0xc0000000;
                  auVar163._20_4_ = 0xc0000000;
                  auVar163._24_4_ = 0xc0000000;
                  auVar163._28_4_ = 0xc0000000;
                  auVar105._0_4_ = auVar113._0_4_ * -2.0;
                  auVar105._4_4_ = auVar113._4_4_ * -2.0;
                  auVar105._8_4_ = auVar113._8_4_ * -2.0;
                  auVar105._12_4_ = auVar113._12_4_ * -2.0;
                  auVar105._16_4_ = 0x80000000;
                  auVar105._20_4_ = 0x80000000;
                  auVar105._24_4_ = 0x80000000;
                  auVar105._28_4_ = 0;
                  auVar117._8_4_ = 0x7fffffff;
                  auVar117._0_8_ = 0x7fffffff7fffffff;
                  auVar117._12_4_ = 0x7fffffff;
                  auVar117._16_4_ = 0x7fffffff;
                  auVar117._20_4_ = 0x7fffffff;
                  auVar117._24_4_ = 0x7fffffff;
                  auVar117._28_4_ = 0x7fffffff;
                  auVar89 = vblendvps_avx(auVar105,auVar117,auVar89);
                  auVar89 = vminps_avx(auVar176,auVar89);
                  auVar180 = ZEXT3264(auVar85);
                  auVar85 = vmaxps_avx(auVar85,auVar89);
                  auVar182 = ZEXT3264(auVar123);
                  auVar113 = vfmadd213ps_fma(auVar123,auVar85,auVar147);
                  auVar123 = vroundps_avx(ZEXT1632(auVar113),1);
                  auVar89 = vcmpps_avx(ZEXT1632(auVar113),auVar123,1);
                  auVar89 = vandps_avx(auVar89,auVar70);
                  auVar89 = vsubps_avx(auVar123,auVar89);
                  auVar113 = vfmsub231ps_fma(auVar85,auVar89,auVar149);
                  auVar167 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar89,auVar177);
                  auVar85 = ZEXT1632(auVar167);
                  auVar102._28_4_ = auVar123._28_4_;
                  auVar102._0_28_ =
                       ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                          CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                                   CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                            auVar167._0_4_ * auVar167._0_4_))));
                  auVar185 = ZEXT3264(auVar68);
                  auVar113 = vfmadd213ps_fma(auVar68,auVar85,auVar184);
                  auVar192._8_4_ = 0x3c088908;
                  auVar192._0_8_ = 0x3c0889083c088908;
                  auVar192._12_4_ = 0x3c088908;
                  auVar192._16_4_ = 0x3c088908;
                  auVar192._20_4_ = 0x3c088908;
                  auVar192._24_4_ = 0x3c088908;
                  auVar192._28_4_ = 0x3c088908;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar192);
                  auVar68._8_4_ = 0x3d2aa9c1;
                  auVar68._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar68._12_4_ = 0x3d2aa9c1;
                  auVar68._16_4_ = 0x3d2aa9c1;
                  auVar68._20_4_ = 0x3d2aa9c1;
                  auVar68._24_4_ = 0x3d2aa9c1;
                  auVar68._28_4_ = 0x3d2aa9c1;
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar68);
                  auVar69._8_4_ = 0x3e2aaaaa;
                  auVar69._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar69._12_4_ = 0x3e2aaaaa;
                  auVar69._16_4_ = 0x3e2aaaaa;
                  auVar69._20_4_ = 0x3e2aaaaa;
                  auVar69._24_4_ = 0x3e2aaaaa;
                  auVar69._28_4_ = 0x3e2aaaaa;
                  auVar85 = ZEXT1632(auVar167);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar69);
                  auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar85,auVar147);
                  auVar111 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar102,auVar85);
                  auVar136 = ZEXT3264(auVar70);
                  auVar91._0_4_ = (int)auVar89._0_4_;
                  auVar91._4_4_ = (int)auVar89._4_4_;
                  auVar91._8_4_ = (int)auVar89._8_4_;
                  auVar91._12_4_ = (int)auVar89._12_4_;
                  auVar106._16_4_ = (int)auVar89._16_4_;
                  auVar106._0_16_ = auVar91;
                  auVar106._20_4_ = (int)auVar89._20_4_;
                  auVar106._24_4_ = (int)auVar89._24_4_;
                  auVar106._28_4_ = (int)auVar89._28_4_;
                  auVar167 = vpslld_avx(auVar91,0x17);
                  auVar113 = vpslld_avx(auVar106._16_16_,0x17);
                  auVar124._8_4_ = 0x3f800000;
                  auVar124._0_8_ = 0x3f8000003f800000;
                  auVar124._12_4_ = 0x3f800000;
                  auVar113 = vpaddd_avx(auVar113,auVar124);
                  auVar167 = vpaddd_avx(auVar167,auVar124);
                  auVar107._16_16_ = auVar113;
                  auVar107._0_16_ = auVar167;
                  auVar118._0_4_ = auVar111._0_4_ + fVar62;
                  auVar118._4_4_ = auVar111._4_4_ + fVar195;
                  auVar118._8_4_ = auVar111._8_4_ + fVar196;
                  auVar118._12_4_ = auVar111._12_4_ + fVar110;
                  auVar118._16_4_ = fVar19 + 0.0;
                  auVar118._20_4_ = fVar20 + 0.0;
                  auVar118._24_4_ = fVar21 + 0.0;
                  auVar118._28_4_ = fVar22 + 0.0;
                  auVar113 = vfmadd213ps_fma(auVar107,auVar118,auVar70);
                  auVar89 = vdivps_avx(auVar70,ZEXT1632(auVar113));
                  auVar70._8_4_ = 0xbf800000;
                  auVar70._0_8_ = 0xbf800000bf800000;
                  auVar70._12_4_ = 0xbf800000;
                  auVar70._16_4_ = 0xbf800000;
                  auVar70._20_4_ = 0xbf800000;
                  auVar70._24_4_ = 0xbf800000;
                  auVar70._28_4_ = 0xbf800000;
                  auVar113 = vfnmadd213ps_fma(auVar89,auVar163,auVar70);
                  auVar101 = ZEXT1628(auVar113);
                  goto LAB_0046b07f;
                case 6:
                  puVar15 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar15;
                  auVar85._4_4_ = uVar1;
                  auVar85._0_4_ = uVar1;
                  auVar85._8_4_ = uVar1;
                  auVar85._12_4_ = uVar1;
                  auVar85._16_4_ = uVar1;
                  auVar85._20_4_ = uVar1;
                  auVar85._24_4_ = uVar1;
                  auVar85._28_4_ = uVar1;
                  uVar1 = puVar15[1];
                  auVar123._4_4_ = uVar1;
                  auVar123._0_4_ = uVar1;
                  auVar123._8_4_ = uVar1;
                  auVar123._12_4_ = uVar1;
                  auVar123._16_4_ = uVar1;
                  auVar123._20_4_ = uVar1;
                  auVar123._24_4_ = uVar1;
                  auVar123._28_4_ = uVar1;
                  auVar113 = vfmadd231ps_fma(auVar123,auVar89,auVar85);
                  auVar89 = vmaxps_avx(ZEXT1632(auVar113),_DAT_005f4f20);
                  auVar89 = vminps_avx(auVar89,auVar70);
                  auVar101 = auVar89._0_28_;
LAB_0046b07f:
                  auVar166._0_4_ = auVar101._0_4_ * auVar90._0_4_;
                  auVar166._4_4_ = auVar101._4_4_ * auVar90._4_4_;
                  auVar166._8_4_ = auVar101._8_4_ * auVar90._8_4_;
                  auVar166._12_4_ = auVar101._12_4_ * auVar90._12_4_;
                  auVar166._16_4_ = auVar101._16_4_ * auVar90._16_4_;
                  auVar166._20_4_ = auVar101._20_4_ * auVar90._20_4_;
                  auVar166._24_4_ = auVar101._24_4_ * auVar90._24_4_;
                  auVar89 = auVar166._0_32_;
                }
                *pauVar51 = auVar89;
                pauVar51 = pauVar51 + 1;
                iVar36 = iVar36 + 1;
                iVar50 = iVar50 + 1;
              } while (iVar36 != iVar41);
            }
            iVar39 = iVar39 + 1;
          } while (iVar39 != iVar47);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != uVar61);
    }
  }
  else {
    local_238 = (int)(uVar35 * iVar57) / iVar56;
    local_248 = iVar48 / iVar56;
    local_2c8 = 1;
    local_2d8 = 1;
    if (opt->use_packing_layout == true) {
      local_2c8 = (uint)((local_238 & 3) == 0) * 3 + 1;
      if ((local_238 & 7) == 0) {
        local_2c8 = 8;
      }
      local_2d8 = (uint)((local_248 & 3) == 0) * 3 + 1;
      if ((local_248 & 7) == 0) {
        local_2d8 = 8;
      }
    }
    piVar12 = bottom_blob->refcount;
    local_1b8._0_8_ = bottom_blob->data;
    local_1b8._8_4_ = SUB84(bottom_blob->refcount,0);
    local_1b8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_1b8._16_8_ = bottom_blob->elemsize;
    local_1b8._24_4_ = bottom_blob->elempack;
    local_1b8._32_8_ = bottom_blob->allocator;
    local_190._0_4_ = bottom_blob->dims;
    local_190._4_4_ = bottom_blob->w;
    local_190._8_4_ = bottom_blob->h;
    local_190._12_4_ = bottom_blob->d;
    local_180 = bottom_blob->c;
    local_178 = bottom_blob->cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    if (local_2c8 < iVar57) {
      local_208._0_8_ = *(undefined8 *)opt;
      local_208._16_8_ = opt->workspace_allocator;
      uVar25 = opt->openmp_blocktime;
      uVar26 = opt->use_winograd_convolution;
      uVar28 = opt->use_sgemm_convolution;
      uVar30 = opt->use_int8_inference;
      uVar32 = opt->use_vulkan_compute;
      uVar31 = CONCAT11(uVar32,uVar30);
      uVar29 = CONCAT21(uVar31,uVar28);
      uVar27 = CONCAT31(uVar29,uVar26);
      local_208._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
      auStack_1e0._0_4_ = opt->vulkan_device_index;
      auStack_1e0[4] = opt->use_reserved_1;
      auStack_1e0[5] = opt->use_image_storage;
      auStack_1e0[6] = opt->use_tensor_storage;
      auStack_1e0[7] = opt->use_reserved_2;
      auStack_1e0._8_4_ = opt->flush_denormals;
      auStack_1e0[0xc] = opt->use_local_pool_allocator;
      auStack_1e0[0xd] = opt->use_shader_local_memory;
      auStack_1e0[0xe] = opt->use_cooperative_matrix;
      auStack_1e0[0xf] = opt->use_winograd23_convolution;
      uStack_1d0._0_1_ = opt->use_winograd43_convolution;
      uStack_1d0._1_1_ = opt->use_winograd63_convolution;
      uStack_1d0._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_1d0._3_1_ = opt->use_fp16_uniform;
      uStack_1d0._4_1_ = opt->use_int8_uniform;
      uStack_1d0._5_1_ = opt->use_reserved_9;
      uStack_1d0._6_1_ = opt->use_reserved_10;
      uStack_1d0._7_1_ = opt->use_reserved_11;
      local_208._8_4_ = SUB84(opt->workspace_allocator,0);
      local_208._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_208._24_4_ = uVar25;
      local_208._28_4_ = uVar27;
      convert_packing(bottom_blob,(Mat *)local_1b8,local_2c8,(Option *)local_208);
      if (((void *)local_1b8._0_8_ != (void *)0x0) && ((long)local_180 * local_178 != 0))
      goto LAB_0046b948;
      bVar18 = false;
      iVar48 = -100;
    }
    else {
LAB_0046b948:
      piVar12 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      local_208._0_8_ = local_298.data;
      local_208._8_4_ = local_298.refcount._0_4_;
      local_208._12_4_ = local_298.refcount._4_4_;
      local_208._16_8_ = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
      local_208._24_4_ = local_298.elempack;
      local_208._32_8_ = local_298.allocator;
      auStack_1e0._4_4_ = local_298.w;
      auStack_1e0._0_4_ = local_298.dims;
      auStack_1e0._8_4_ = local_298.h;
      auStack_1e0._12_4_ = local_298.d;
      uStack_1d0 = CONCAT44(uStack_1d0._4_4_,local_298.c);
      local_1c8 = local_298.cstep;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      if ((local_2d8 < uVar34) &&
         ((Mat::create((Mat *)local_208,iVar41,iVar47,
                       (this->super_DeconvolutionDepthWise).num_output / (int)local_2d8,
                       (ulong)local_2d8 * (sVar59 / uVar34),local_2d8,opt->workspace_allocator),
          (void *)local_208._0_8_ == (void *)0x0 || ((long)(int)uStack_1d0 * local_1c8 == 0)))) {
LAB_0046c215:
        bVar18 = false;
        iVar48 = -100;
      }
      else {
        iVar48 = (this->super_DeconvolutionDepthWise).group;
        bVar18 = 0 < iVar48;
        if (iVar48 < 1) {
          iVar48 = -100;
        }
        else {
          iVar47 = (int)local_238 / local_2c8;
          iVar41 = (int)local_248 / (int)local_2d8;
          iVar48 = -100;
          iVar57 = 0;
          iVar56 = 0;
          lVar60 = 0;
          do {
            local_f8 = (void *)((long)(iVar57 / local_2c8) * local_178 * local_1b8._16_8_ +
                               local_1b8._0_8_);
            uStack_f0 = 0;
            uStack_ec = 0;
            local_e8 = local_1b8._16_8_;
            local_e0 = local_1b8._24_4_;
            local_d8 = (Allocator *)local_1b8._32_8_;
            local_b8 = ((long)(int)local_190._12_4_ * local_1b8._16_8_ *
                        (long)(int)local_190._8_4_ * (long)(int)local_190._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_1b8._16_8_;
            local_d0 = local_190;
            local_148 = (void *)((long)(iVar56 / (int)local_2d8) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = (Allocator *)local_208._16_8_;
            local_130 = local_208._24_4_;
            local_128 = (Allocator *)local_208._32_8_;
            local_108 = ((long)(int)auStack_1e0._12_4_ * local_208._16_8_ *
                         (long)(int)auStack_1e0._8_4_ * (long)(int)auStack_1e0._4_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_120 = auStack_1e0;
            pLVar16 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar60];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = (Allocator *)local_208._32_8_;
            local_110 = iVar41;
            local_c0 = iVar47;
            iVar39 = (*pLVar16->_vptr_Layer[7])(pLVar16,&local_f8,&local_148,&local_78);
            if (iVar39 != 0) {
              iVar48 = iVar39;
            }
            piVar12 = (int *)CONCAT44(uStack_13c,uStack_140);
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                if (local_128 == (Allocator *)0x0) {
                  if (local_148 != (void *)0x0) {
                    free(local_148);
                  }
                }
                else {
                  (*local_128->_vptr_Allocator[3])();
                }
              }
            }
            local_108 = 0;
            local_148 = (void *)0x0;
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = (Allocator *)0x0;
            local_130 = 0;
            local_120 = (undefined1  [16])0x0;
            local_110 = 0;
            piVar12 = (int *)CONCAT44(uStack_ec,uStack_f0);
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                if (local_d8 == (Allocator *)0x0) {
                  if (local_f8 != (void *)0x0) {
                    free(local_f8);
                  }
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
            local_b8 = 0;
            local_f8 = (void *)0x0;
            uStack_f0 = 0;
            uStack_ec = 0;
            local_e8 = 0;
            local_e0 = 0;
            local_d0 = (undefined1  [16])0x0;
            local_c0 = 0;
            if (iVar39 != 0) break;
            lVar60 = lVar60 + 1;
            lVar52 = (long)(this->super_DeconvolutionDepthWise).group;
            iVar56 = iVar56 + local_248;
            iVar57 = iVar57 + local_238;
            bVar18 = lVar60 < lVar52;
          } while (lVar60 < lVar52);
        }
        if (bVar18) {
          bVar18 = false;
        }
        else {
          if (local_2d8 < uVar34) {
            convert_packing((Mat *)local_208,&local_298,uVar34,opt);
            if (local_298.data == (void *)0x0) goto LAB_0046c215;
            if ((long)local_298.c * local_298.cstep == 0) {
              bVar18 = false;
              iVar48 = -100;
              goto LAB_0046c3d6;
            }
          }
          else {
            piVar12 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + 1;
              UNLOCK();
            }
            piVar12 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                if (local_298.allocator == (Allocator *)0x0) {
                  if (local_298.data != (void *)0x0) {
                    free(local_298.data);
                  }
                }
                else {
                  (*(local_298.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            auVar113 = auStack_1e0;
            local_298.data = (void *)local_208._0_8_;
            local_298.refcount._0_4_ = local_208._8_4_;
            local_298.refcount._4_4_ = local_208._12_4_;
            local_298.elemsize._0_4_ = (undefined4)local_208._16_8_;
            local_298.elemsize._4_4_ = SUB84(local_208._16_8_,4);
            local_298.elempack = local_208._24_4_;
            local_298.allocator = (Allocator *)local_208._32_8_;
            local_298.dims = auStack_1e0._0_4_;
            local_298.w = auStack_1e0._4_4_;
            local_298.h = auStack_1e0._8_4_;
            local_298.d = auStack_1e0._12_4_;
            local_298.c = (int)uStack_1d0;
            local_298.cstep = local_1c8;
            auStack_1e0 = auVar113;
          }
          bVar18 = true;
        }
      }
LAB_0046c3d6:
      piVar12 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_8_ = (Allocator *)0x0;
      local_208._24_4_ = 0;
      auStack_1e0 = (undefined1  [16])0x0;
      uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    }
    piVar12 = (int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if ((Allocator *)local_1b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_1b8._0_8_ != (void *)0x0) {
            free((void *)local_1b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_1b8._32_8_)[3])();
        }
      }
    }
    local_178 = 0;
    local_1b8._0_8_ = (void *)0x0;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_8_ = 0;
    local_1b8._24_4_ = 0;
    local_190 = (undefined1  [16])0x0;
    local_180 = 0;
    if (!bVar18) goto LAB_0046c4fd;
  }
  pMVar33 = local_1c0;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_298,local_1c0,opt);
  iVar48 = -100;
  if ((pMVar33->data != (void *)0x0) && (iVar48 = -100, (long)local_1c0->c * local_1c0->cstep != 0))
  {
    iVar48 = 0;
  }
LAB_0046c4fd:
  piVar12 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}